

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O0

xmlAttrPtr xmlGetID(xmlDocPtr doc,xmlChar *ID)

{
  void *pvVar1;
  xmlIDPtr id;
  xmlIDTablePtr table;
  xmlChar *ID_local;
  xmlDocPtr doc_local;
  
  if (doc == (xmlDocPtr)0x0) {
    doc_local = (xmlDocPtr)0x0;
  }
  else if (ID == (xmlChar *)0x0) {
    doc_local = (xmlDocPtr)0x0;
  }
  else if ((xmlHashTablePtr)doc->ids == (xmlHashTablePtr)0x0) {
    doc_local = (xmlDocPtr)0x0;
  }
  else {
    pvVar1 = xmlHashLookup((xmlHashTablePtr)doc->ids,ID);
    if (pvVar1 == (void *)0x0) {
      doc_local = (xmlDocPtr)0x0;
    }
    else {
      doc_local = doc;
      if (*(long *)((long)pvVar1 + 0x10) != 0) {
        doc_local = *(xmlDocPtr *)((long)pvVar1 + 0x10);
      }
    }
  }
  return (xmlAttrPtr)doc_local;
}

Assistant:

xmlAttrPtr
xmlGetID(xmlDocPtr doc, const xmlChar *ID) {
    xmlIDTablePtr table;
    xmlIDPtr id;

    if (doc == NULL) {
	return(NULL);
    }

    if (ID == NULL) {
	return(NULL);
    }

    table = (xmlIDTablePtr) doc->ids;
    if (table == NULL)
        return(NULL);

    id = xmlHashLookup(table, ID);
    if (id == NULL)
	return(NULL);
    if (id->attr == NULL) {
	/*
	 * We are operating on a stream, return a well known reference
	 * since the attribute node doesn't exist anymore
	 */
	return((xmlAttrPtr) doc);
    }
    return(id->attr);
}